

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclReadSurface(Vec_Str_t *vOut,int *pPos,SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  float *pfVar2;
  Vec_Int_t *p_01;
  int *piVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  
  iVar1 = Vec_StrGetI(vOut,pPos);
  while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
    fVar7 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex0,fVar7);
    Vec_IntPush(&p->vIndex0I,(int)(fVar7 * 1000.0));
  }
  iVar1 = Vec_StrGetI(vOut,pPos);
  while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
    fVar7 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex1,fVar7);
    Vec_IntPush(&p->vIndex1I,(int)(fVar7 * 1000.0));
  }
  iVar1 = 0;
  while( true ) {
    if ((p->vIndex0).nSize <= iVar1) break;
    iVar5 = (p->vIndex1).nSize;
    p_00 = (Vec_Flt_t *)malloc(0x10);
    if (iVar5 - 1U < 0xf) {
      iVar5 = 0x10;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar5;
    if (iVar5 == 0) {
      pfVar2 = (float *)0x0;
    }
    else {
      pfVar2 = (float *)malloc((long)iVar5 << 2);
    }
    p_00->pArray = pfVar2;
    Vec_PtrPush(&p->vData,p_00);
    iVar5 = (p->vIndex1).nSize;
    p_01 = (Vec_Int_t *)malloc(0x10);
    if (iVar5 - 1U < 0xf) {
      iVar5 = 0x10;
    }
    p_01->nSize = 0;
    p_01->nCap = iVar5;
    if (iVar5 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar5 << 2);
    }
    p_01->pArray = piVar3;
    Vec_PtrPush(&p->vDataI,p_01);
    for (iVar5 = 0; iVar5 < (p->vIndex1).nSize; iVar5 = iVar5 + 1) {
      fVar7 = Vec_StrGetF(vOut,pPos);
      Vec_FltPush(p_00,fVar7);
      Vec_IntPush(p_01,(int)(fVar7 * 1000.0));
    }
    iVar1 = iVar1 + 1;
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    fVar7 = Vec_StrGetF(vOut,pPos);
    p->approx[0][lVar4] = fVar7;
  }
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    fVar7 = Vec_StrGetF(vOut,pPos);
    p->approx[1][lVar4] = fVar7;
  }
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    fVar7 = Vec_StrGetF(vOut,pPos);
    p->approx[2][lVar4] = fVar7;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurface( Vec_Str_t * vOut, int * pPos, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex0, Num );
        Vec_IntPush( &p->vIndex0I, (int)(MIO_NUM*Num) );
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex1, Num );
        Vec_IntPush( &p->vIndex1I, (int)(MIO_NUM*Num) );
    }

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            float Num = Vec_StrGetF(vOut, pPos);
            Vec_FltPush( vVec, Num );
            Vec_IntPush( vVecI, (int)(MIO_NUM*Num) );
        }
    }

    for ( i = 0; i < 3; i++ ) 
        p->approx[0][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 4; i++ ) 
        p->approx[1][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 6; i++ ) 
        p->approx[2][i] = Vec_StrGetF( vOut, pPos );
}